

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O2

Address * cfd::ElementsAddressFactory::CreatePegInAddress
                    (Address *__return_storage_ptr__,NetType mainchain_net_type,
                    AddressType address_type,Script *tweak_fedpegscript)

{
  CfdException *this;
  allocator local_51;
  Script witness_program;
  
  if (address_type == kP2shP2wshAddress) {
    core::ScriptUtil::CreateP2wshLockingScript(&witness_program,tweak_fedpegscript);
    core::Address::Address(__return_storage_ptr__,mainchain_net_type,&witness_program);
    core::Script::~Script(&witness_program);
  }
  else if (address_type == kP2wshAddress) {
    core::Address::Address(__return_storage_ptr__,mainchain_net_type,kVersion0,tweak_fedpegscript);
  }
  else {
    if (address_type != kP2shAddress) {
      this = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&witness_program,
                 "Pubkey-hash cannot be used for the peg-in address type.",&local_51);
      core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&witness_program);
      __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Address::Address(__return_storage_ptr__,mainchain_net_type,tweak_fedpegscript);
  }
  return __return_storage_ptr__;
}

Assistant:

Address ElementsAddressFactory::CreatePegInAddress(
    NetType mainchain_net_type, AddressType address_type,
    const Script& tweak_fedpegscript) {
  if (address_type == AddressType::kP2shAddress) {
    return Address(mainchain_net_type, tweak_fedpegscript);
  } else if (address_type == AddressType::kP2wshAddress) {
    return Address(
        mainchain_net_type, WitnessVersion::kVersion0, tweak_fedpegscript);
  } else if (address_type == AddressType::kP2shP2wshAddress) {
    Script witness_program =
        ScriptUtil::CreateP2wshLockingScript(tweak_fedpegscript);
    return Address(mainchain_net_type, witness_program);
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Pubkey-hash cannot be used for the peg-in address type.");
  }
}